

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<128U,_unsigned_int,_void,_false>
math::wide_integer::pow<int,128u,unsigned_int,void,false>
          (uintwide_t<128U,_unsigned_int,_void,_false> *b,int *p)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  representation_type rVar4;
  bool bVar5;
  local_wide_integer_type result;
  local_wide_integer_type y;
  local_wide_integer_type p_local;
  uintwide_t<128U,_unsigned_int,_void,_false> local_38;
  
  uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t(&result);
  iVar1 = *p;
  if (iVar1 == 2) {
    uVar2 = *(undefined8 *)(b->values).super_array<unsigned_int,_4UL>.elems;
    uVar3 = *(undefined8 *)((b->values).super_array<unsigned_int,_4UL>.elems + 2);
    result.values.super_array<unsigned_int,_4UL>.elems[0] = (value_type_conflict)uVar2;
    result.values.super_array<unsigned_int,_4UL>.elems[1] =
         (value_type_conflict)((ulong)uVar2 >> 0x20);
    result.values.super_array<unsigned_int,_4UL>.elems[2] = (value_type_conflict)uVar3;
    result.values.super_array<unsigned_int,_4UL>.elems[3] =
         (value_type_conflict)((ulong)uVar3 >> 0x20);
    uintwide_t<128U,_unsigned_int,_void,_false>::operator*=(&result,b);
  }
  else if (iVar1 == 1) {
    result.values.super_array<unsigned_int,_4UL>.elems[0] =
         (b->values).super_array<unsigned_int,_4UL>.elems[0];
    result.values.super_array<unsigned_int,_4UL>.elems[1] =
         (b->values).super_array<unsigned_int,_4UL>.elems[1];
    result.values.super_array<unsigned_int,_4UL>.elems[2] =
         (b->values).super_array<unsigned_int,_4UL>.elems[2];
    result.values.super_array<unsigned_int,_4UL>.elems[3] =
         (b->values).super_array<unsigned_int,_4UL>.elems[3];
  }
  else {
    if (iVar1 != 0) {
      uintwide_t<128u,unsigned_int,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
      enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
      value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::
      digits),void>::type__
                (&y,'\x01',
                 (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                  *)0x0);
      result.values.super_array<unsigned_int,_4UL>.elems[0] =
           y.values.super_array<unsigned_int,_4UL>.elems[0];
      result.values.super_array<unsigned_int,_4UL>.elems[1] =
           y.values.super_array<unsigned_int,_4UL>.elems[1];
      result.values.super_array<unsigned_int,_4UL>.elems[2] =
           y.values.super_array<unsigned_int,_4UL>.elems[2];
      result.values.super_array<unsigned_int,_4UL>.elems[3] =
           y.values.super_array<unsigned_int,_4UL>.elems[3];
      y.values.super_array<unsigned_int,_4UL>.elems._0_8_ =
           *(undefined8 *)(b->values).super_array<unsigned_int,_4UL>.elems;
      y.values.super_array<unsigned_int,_4UL>.elems._8_8_ =
           *(undefined8 *)((b->values).super_array<unsigned_int,_4UL>.elems + 2);
      uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t<int>
                ((uintwide_t<128U,_unsigned_int,_void,_false> *)&p_local,*p,
                 (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
      do {
        if (p_local.values.super_array<unsigned_int,_4UL>.elems[0] == 0) {
          uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t<int>
                    (&local_38,0,
                     (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)
                     0x0);
          bVar5 = uintwide_t<128U,_unsigned_int,_void,_false>::operator!=
                            ((uintwide_t<128U,_unsigned_int,_void,_false> *)&p_local,&local_38);
          if (!bVar5) goto LAB_0012f582;
        }
        else if ((p_local.values.super_array<unsigned_int,_4UL>.elems[0] & 1) != 0) {
          uintwide_t<128U,_unsigned_int,_void,_false>::operator*=(&result,&y);
        }
        uintwide_t<128U,_unsigned_int,_void,_false>::operator*=(&y,&y);
        uintwide_t<128u,unsigned_int,void,false>::operator>>=
                  ((uintwide_t<128u,unsigned_int,void,false> *)&p_local,1);
      } while( true );
    }
    uintwide_t<128u,unsigned_int,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
    enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::value)&&(std
    ::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::digits),void>::
    type__(&y,'\x01',
           (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
            *)0x0);
    result.values.super_array<unsigned_int,_4UL>.elems[0] =
         y.values.super_array<unsigned_int,_4UL>.elems[0];
    result.values.super_array<unsigned_int,_4UL>.elems[1] =
         y.values.super_array<unsigned_int,_4UL>.elems[1];
    result.values.super_array<unsigned_int,_4UL>.elems[2] =
         y.values.super_array<unsigned_int,_4UL>.elems[2];
    result.values.super_array<unsigned_int,_4UL>.elems[3] =
         y.values.super_array<unsigned_int,_4UL>.elems[3];
  }
LAB_0012f582:
  rVar4.super_array<unsigned_int,_4UL>.elems[1] =
       result.values.super_array<unsigned_int,_4UL>.elems[1];
  rVar4.super_array<unsigned_int,_4UL>.elems[0] =
       result.values.super_array<unsigned_int,_4UL>.elems[0];
  rVar4.super_array<unsigned_int,_4UL>.elems[2] =
       result.values.super_array<unsigned_int,_4UL>.elems[2];
  rVar4.super_array<unsigned_int,_4UL>.elems[3] =
       result.values.super_array<unsigned_int,_4UL>.elems[3];
  return (representation_type)(representation_type)rVar4.super_array<unsigned_int,_4UL>.elems;
}

Assistant:

constexpr auto pow(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& b, const OtherIntegralTypeP& p) -> uintwide_t<Width2, LimbType, AllocatorType, IsSigned>
  {
    // Calculate (b ^ p).
    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_limb_type         = typename local_wide_integer_type::limb_type;

    local_wide_integer_type result;
    auto p0 = static_cast<local_limb_type>(p);

    if((p0 == static_cast<local_limb_type>(UINT8_C(0))) && (p == static_cast<OtherIntegralTypeP>(0)))
    {
      result = local_wide_integer_type(static_cast<std::uint8_t>(UINT8_C(1)));
    }
    else if((p0 == static_cast<local_limb_type>(UINT8_C(1))) && (p == static_cast<OtherIntegralTypeP>(UINT8_C(1))))
    {
      result = b;
    }
    else if((p0 == static_cast<local_limb_type>(UINT8_C(2))) && (p == static_cast<OtherIntegralTypeP>(UINT8_C(2))))
    {
      result  = b;
      result *= b;
    }
    else
    {
      result = local_wide_integer_type(static_cast<std::uint8_t>(UINT8_C(1)));

      local_wide_integer_type y      (b);
      local_wide_integer_type p_local(p);

      while(((p0 = static_cast<local_limb_type>(p_local)) != static_cast<local_limb_type>(UINT8_C(0))) || (p_local != static_cast<local_wide_integer_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(p0 & static_cast<local_limb_type>(UINT8_C(1))) != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          result *= y;
        }

        y *= y;

        p_local >>= 1U;
      }
    }

    return result;
  }